

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

string * __thiscall
miniros::Connection::getRemoteString_abi_cxx11_(string *__return_storage_ptr__,Connection *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1e0 [32];
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"callerid=[");
  getCallerId_abi_cxx11_(&local_1c0,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"] address=[");
  (*((this->transport_).super___shared_ptr<miniros::Transport,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Transport[10])(local_1e0);
  poVar1 = std::operator<<(poVar1,local_1e0);
  std::operator<<(poVar1,"]");
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string Connection::getRemoteString()
{
  std::stringstream ss;
  ss << "callerid=[" << getCallerId() << "] address=[" << transport_->getTransportInfo() << "]";
  return ss.str();
}